

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O0

mfb_stub * mfb_stub::GetInstance(mfb_window *window)

{
  bool bVar1;
  int iVar2;
  reference ppmVar3;
  mfb_stub *this;
  reference ppmVar4;
  mfb_window *in_RDI;
  mfb_stub *instance;
  iterator __end1;
  iterator __begin1;
  vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *__range1;
  vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<mfb_stub_**,_std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<mfb_stub_**,_std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>_> local_20;
  vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *local_18;
  mfb_window *local_10;
  
  local_10 = in_RDI;
  if ((GetInstance(mfb_window*)::s_instances == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetInstance(mfb_window*)::s_instances), iVar2 != 0)) {
    std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::vector
              ((vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *)0x108a4f);
    __cxa_atexit(std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::~vector,
                 &GetInstance::s_instances,&__dso_handle);
    __cxa_guard_release(&GetInstance(mfb_window*)::s_instances);
  }
  local_18 = &GetInstance::s_instances;
  local_20._M_current =
       (mfb_stub **)
       std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<mfb_stub_**,_std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      this = (mfb_stub *)operator_new(0xe8);
      mfb_stub(this);
      std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::push_back
                ((vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *)this,
                 (value_type *)in_stack_ffffffffffffffa8);
      ppmVar4 = std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::back
                          ((vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *)this);
      (*ppmVar4)->m_window = local_10;
      ppmVar4 = std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::back
                          ((vector<mfb_stub_*,_std::allocator<mfb_stub_*>_> *)this);
      return *ppmVar4;
    }
    ppmVar3 = __gnu_cxx::
              __normal_iterator<mfb_stub_**,_std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>_>
              ::operator*(&local_20);
    if ((*ppmVar3)->m_window == local_10) break;
    __gnu_cxx::__normal_iterator<mfb_stub_**,_std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>_>
    ::operator++(&local_20);
  }
  return *ppmVar3;
}

Assistant:

mfb_stub *
mfb_stub::GetInstance(struct mfb_window *window) {
    static std::vector<mfb_stub *>  s_instances;

    for(mfb_stub *instance : s_instances) {
        if(instance->m_window == window) {
            return instance;
        }
    }

    s_instances.push_back(new mfb_stub);
    s_instances.back()->m_window = window;

    return s_instances.back();
}